

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

Promise<void> __thiscall
capnp::LocalClient::callInternal
          (LocalClient *this,uint64_t interfaceId,uint16_t methodId,CallContextHook *context)

{
  SourceLocation location;
  bool bVar1;
  Exception *t;
  Own<capnp::Capability::Server,_std::nullptr_t> **ppOVar2;
  Server *pSVar3;
  Canceler *promise;
  Promise<void> *pPVar4;
  undefined6 in_register_00000012;
  CallContextHook *in_R8;
  Own<capnp::LocalClient,_std::nullptr_t> OVar5;
  BlockingScope local_2e8 [2];
  SourceLocation local_2d8;
  uint64_t local_2c0;
  BlockingScope local_2b8;
  Type local_2a9;
  undefined1 local_2a8 [24];
  SourceLocation local_290;
  Own<capnp::CallContextHook,_std::nullptr_t> local_278;
  undefined1 local_268 [32];
  ForkedPromise<void> fork;
  Canceler local_238;
  Canceler *local_230;
  Canceler *r;
  Canceler *_r867;
  Own<capnp::Capability::Server,_std::nullptr_t> *local_218;
  Fault local_210;
  coroutine_handle<void> local_208;
  Own<capnp::Capability::Server,_std::nullptr_t> *_kj_result;
  DispatchCallResult result;
  Exception *e;
  Exception *_e858;
  Fault local_40;
  Fault f;
  DebugExpression<bool> _kjCondition;
  CallContextHook *context_local;
  uint16_t methodId_local;
  uint64_t interfaceId_local;
  LocalClient *this_local;
  
  f.exception._6_1_ = (*(byte *)(interfaceId + 0x78) ^ 0xff) & 1;
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)((long)&f.exception + 7))
  ;
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              (&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
               ,0x358,FAILED,"!blocked","_kjCondition,",
               (DebugExpression<bool> *)((long)&f.exception + 7));
    kj::_::Debug::Fault::fatal(&local_40);
  }
  t = kj::_::readMaybe<kj::Exception>((Maybe<kj::Exception> *)(interfaceId + 0x80));
  if (t == (Exception *)0x0) {
    local_208._M_fr_ptr =
         kj::_::readMaybe<capnp::Capability::Server,decltype(nullptr)>
                   ((Maybe<kj::Own<capnp::Capability::Server,_std::nullptr_t>_> *)
                    (interfaceId + 0x20));
    if ((Own<capnp::Capability::Server,_std::nullptr_t> *)local_208._M_fr_ptr ==
        (Own<capnp::Capability::Server,_std::nullptr_t> *)0x0) {
      kj::_::Debug::Fault::Fault
                (&local_210,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
                 ,0x360,FAILED,"server != nullptr","");
      kj::_::Debug::Fault::fatal(&local_210);
    }
    ppOVar2 = kj::mv<kj::Own<capnp::Capability::Server,decltype(nullptr)>*>
                        ((Own<capnp::Capability::Server,_std::nullptr_t> **)&local_208);
    local_218 = *ppOVar2;
    pSVar3 = kj::Own<capnp::Capability::Server,_std::nullptr_t>::operator->(local_218);
    CallContext<capnp::AnyPointer,_capnp::AnyPointer>::CallContext
              ((CallContext<capnp::AnyPointer,_capnp::AnyPointer> *)&_r867,in_R8);
    (**pSVar3->_vptr_Server)
              (&_kj_result,pSVar3,CONCAT62(in_register_00000012,methodId),(ulong)context & 0xffff,
               _r867);
    promise = kj::_::readMaybe<kj::Canceler>((Maybe<kj::Canceler> *)(interfaceId + 0x68));
    r = promise;
    if (promise != (Canceler *)0x0) {
      local_230 = promise;
      pPVar4 = kj::mv<kj::Promise<void>>((Promise<void> *)&_kj_result);
      kj::Promise<void>::Promise((Promise<void> *)&fork.hub.ptr,pPVar4);
      kj::Canceler::wrap<void>(&local_238,(Promise<void> *)promise);
      kj::Promise<void>::operator=((Promise<void> *)&_kj_result,(Promise<void> *)&local_238);
      kj::Promise<void>::~Promise((Promise<void> *)&local_238);
      kj::Promise<void>::~Promise((Promise<void> *)&fork.hub.ptr);
    }
    if ((result.promise.super_PromiseBase.node.ptr._1_1_ & 1) == 0) {
      OVar5 = kj::addRef<capnp::LocalClient>((kj *)local_268,(LocalClient *)interfaceId);
      (*in_R8->_vptr_CallContextHook[7])(&local_278,in_R8,OVar5.ptr);
      kj::Promise<void>::
      attach<kj::Own<capnp::LocalClient,decltype(nullptr)>,kj::Own<capnp::CallContextHook,decltype(nullptr)>>
                ((Promise<void> *)(local_268 + 0x10),
                 (Own<capnp::LocalClient,_std::nullptr_t> *)&_kj_result,
                 (Own<capnp::CallContextHook,_std::nullptr_t> *)local_268);
      kj::SourceLocation::SourceLocation
                (&local_290,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
                 ,"callInternal",0x369,0x13);
      kj::Promise<void>::fork((Promise<void> *)(local_268 + 0x18));
      kj::Promise<void>::~Promise((Promise<void> *)(local_268 + 0x10));
      kj::Own<capnp::CallContextHook,_std::nullptr_t>::~Own(&local_278);
      kj::Own<capnp::LocalClient,_std::nullptr_t>::~Own
                ((Own<capnp::LocalClient,_std::nullptr_t> *)local_268);
      kj::ForkedPromise<void>::addBranch((ForkedPromise<void> *)(local_2a8 + 8));
      kj::Promise<void>::operator=((Promise<void> *)&_kj_result,(Promise<void> *)(local_2a8 + 8));
      kj::Promise<void>::~Promise((Promise<void> *)(local_2a8 + 8));
      kj::ForkedPromise<void>::addBranch((ForkedPromise<void> *)local_2a8);
      kj::Promise<void>::
      detach<capnp::LocalClient::callInternal(unsigned_long,unsigned_short,capnp::CallContextHook&)::_lambda(kj::Exception&&)_1_>
                ((Promise<void> *)local_2a8,&local_2a9);
      kj::Promise<void>::~Promise((Promise<void> *)local_2a8);
      kj::ForkedPromise<void>::~ForkedPromise((ForkedPromise<void> *)(local_268 + 0x18));
    }
    if (((byte)result.promise.super_PromiseBase.node.ptr & 1) == 0) {
      pPVar4 = kj::mv<kj::Promise<void>>((Promise<void> *)&_kj_result);
      kj::Promise<void>::Promise((Promise<void> *)this,pPVar4);
    }
    else {
      local_2c0 = interfaceId;
      kj::SourceLocation::SourceLocation
                (&local_2d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++"
                 ,"callInternal",0x372,0xe);
      location.function = local_2d8.function;
      location.fileName = local_2d8.fileName;
      location.lineNumber = local_2d8.lineNumber;
      location.columnNumber = local_2d8.columnNumber;
      kj::Promise<void>::
      catch_<capnp::LocalClient::callInternal(unsigned_long,unsigned_short,capnp::CallContextHook&)::_lambda(kj::Exception&&)_2_>
                ((Promise<void> *)&local_2b8,(Type *)&_kj_result,location);
      BlockingScope::BlockingScope(local_2e8,(LocalClient *)interfaceId);
      kj::Promise<void>::attach<capnp::LocalClient::BlockingScope>((Promise<void> *)this,&local_2b8)
      ;
      BlockingScope::~BlockingScope(local_2e8);
      kj::Promise<void>::~Promise((Promise<void> *)&local_2b8);
    }
    Capability::Server::DispatchCallResult::~DispatchCallResult((DispatchCallResult *)&_kj_result);
  }
  else {
    kj::cp<kj::Exception>((Exception *)&result.isStreaming,t);
    kj::Promise<void>::Promise((Promise<void> *)this,(Exception *)&result.isStreaming);
    kj::Exception::~Exception((Exception *)&result.isStreaming);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> callInternal(uint64_t interfaceId, uint16_t methodId,
                                 CallContextHook& context) {
    KJ_ASSERT(!blocked);

    KJ_IF_SOME(e, brokenException) {
      // Previous streaming call threw, so everything fails from now on.
      return kj::cp(e);
    }

    // `server` can't be null here since `brokenException` is null.
    auto result = KJ_ASSERT_NONNULL(server)->dispatchCall(interfaceId, methodId,
                                       CallContext<AnyPointer, AnyPointer>(context));

    KJ_IF_SOME(r, revoker) {
      result.promise = r.wrap(kj::mv(result.promise));
    }

    if (!result.allowCancellation) {
      // Make sure this call cannot be canceled by forking the promise and detaching one branch.
      auto fork = result.promise.attach(kj::addRef(*this), context.addRef()).fork();
      result.promise = fork.addBranch();
      fork.addBranch().detach([](kj::Exception&&) {
        // Exception from canceled call is silently discarded. The caller should have waited for
        // it if they cared.
      });
    }

    if (result.isStreaming) {
      return result.promise
          .catch_([this](kj::Exception&& e) {
        brokenException = kj::cp(e);
        kj::throwRecoverableException(kj::mv(e));
      }).attach(BlockingScope(*this));
    } else {
      return kj::mv(result.promise);
    }
  }